

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int io_type(lua_State *L)

{
  int iVar1;
  long *len;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  void *ud;
  int in_stack_0000001c;
  lua_State *in_stack_00000020;
  int in_stack_ffffffffffffffec;
  lua_State *in_stack_fffffffffffffff0;
  
  luaL_checkany(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  len = (long *)lua_touserdata(in_RDI,(int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  lua_getfield(in_stack_00000020,in_stack_0000001c,(char *)L);
  if (((len == (long *)0x0) || (iVar1 = lua_getmetatable(L,ud._4_4_), iVar1 == 0)) ||
     (iVar1 = lua_rawequal(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI), iVar1 == 0)) {
    lua_pushnil(in_RDI);
  }
  else if (*len == 0) {
    lua_pushlstring(unaff_retaddr,(char *)in_RDI,(size_t)len);
  }
  else {
    lua_pushlstring(unaff_retaddr,(char *)in_RDI,(size_t)len);
  }
  return 1;
}

Assistant:

static int io_type(lua_State*L){
void*ud;
luaL_checkany(L,1);
ud=lua_touserdata(L,1);
lua_getfield(L,(-10000),"FILE*");
if(ud==NULL||!lua_getmetatable(L,1)||!lua_rawequal(L,-2,-1))
lua_pushnil(L);
else if(*((FILE**)ud)==NULL)
lua_pushliteral(L,"closed file");
else
lua_pushliteral(L,"file");
return 1;
}